

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

void dispatch_interrupt(Emulator *e)

{
  Ticks *pTVar1;
  byte bVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  CpuState CVar6;
  Ticks TVar7;
  u8 uVar8;
  byte bVar9;
  ushort uVar10;
  bool bVar11;
  
  CVar6 = (e->state).interrupt.state;
  if (((e->state).interrupt.ime == FALSE) && (CVar6 < CPU_STATE_HALT)) {
    return;
  }
  (e->state).interrupt.ime = FALSE;
  (e->state).interrupt.state = CPU_STATE_NORMAL;
  uVar3 = (e->state).reg.SP;
  (e->state).reg.SP = uVar3 - 1;
  write_u8_tick(e,uVar3 - 1,*(u8 *)((long)&(e->state).reg.PC + 1));
  bVar2 = (e->state).interrupt.new_if;
  bVar9 = (e->state).interrupt.ie & bVar2;
  if ((bVar9 & 1) == 0) {
    if ((bVar9 & 2) == 0) {
      if ((bVar9 & 4) != 0) {
        (e->state).interrupt.new_if = bVar2 & 0xfb;
        uVar5 = (e->state).reg.SP;
        (e->state).reg.SP = uVar5 - 1;
        write_u8_tick(e,uVar5 - 1,(u8)(e->state).reg.PC);
        (e->state).reg.PC = 0x50;
        uVar8 = (e->state).interrupt.new_if;
        if (CPU_STATE_HALT_BUG < CVar6) {
          pTVar1 = &(e->state).ticks;
          *pTVar1 = *pTVar1 + (e->state).cpu_tick;
        }
        goto LAB_0010d70b;
      }
      if ((bVar9 & 8) == 0) {
        bVar11 = (bVar9 & 0x10) == 0;
        uVar10 = 0x60;
        if (bVar11) {
          uVar10 = bVar9 & 0x10;
        }
        bVar9 = -bVar11 | 0xef;
      }
      else {
        uVar10 = 0x58;
        bVar9 = 0xf7;
      }
    }
    else {
      uVar10 = 0x48;
      bVar9 = 0xfd;
    }
  }
  else {
    uVar10 = 0x40;
    bVar9 = 0xfe;
  }
  (e->state).interrupt.new_if = bVar9 & bVar2;
  uVar4 = (e->state).reg.SP;
  (e->state).reg.SP = uVar4 - 1;
  write_u8_tick(e,uVar4 - 1,(u8)(e->state).reg.PC);
  (e->state).reg.PC = uVar10;
  uVar8 = (e->state).interrupt.new_if;
LAB_0010d70b:
  TVar7 = (e->state).cpu_tick;
  (e->state).interrupt.if_ = uVar8;
  pTVar1 = &(e->state).ticks;
  *pTVar1 = *pTVar1 + TVar7 * 2;
  return;
}

Assistant:

static void dispatch_interrupt(Emulator* e) {
  Bool was_halt = INTR.state >= CPU_STATE_HALT;
  if (!(INTR.ime || was_halt)) {
    return;
  }

  INTR.ime = FALSE;
  INTR.state = CPU_STATE_NORMAL;

  /* Write MSB of PC. */
  RSP--; WRITE8(RSP, REG.PC >> 8);

  /* Now check which interrupt to raise, after having written the MSB of PC.
   * This behavior is needed to pass the ie_push mooneye-gb test. */
  u8 interrupt = INTR.new_if & INTR.ie;

  Bool delay = FALSE;
  u8 mask = 0;
  Address vector = 0;
  if (interrupt & IF_VBLANK) {
    HOOK(vblank_interrupt_i, PPU.frame);
    vector = 0x40;
    mask = IF_VBLANK;
  } else if (interrupt & IF_STAT) {
    HOOK(stat_interrupt_cccc, STAT.y_compare.irq ? 'Y' : '.',
         STAT.mode2.irq ? 'O' : '.', STAT.vblank.irq ? 'V' : '.',
         STAT.hblank.irq ? 'H' : '.');
    vector = 0x48;
    mask = IF_STAT;
  } else if (interrupt & IF_TIMER) {
    HOOK0(timer_interrupt_v);
    vector = 0x50;
    mask = IF_TIMER;
    delay = was_halt;
  } else if (interrupt & IF_SERIAL) {
    HOOK0(serial_interrupt_v);
    vector = 0x58;
    mask = IF_SERIAL;
  } else if (interrupt & IF_JOYPAD) {
    HOOK0(joypad_interrupt_v);
    vector = 0x60;
    mask = IF_JOYPAD;
  } else {
    /* Interrupt was canceled. */
    vector = 0;
    mask = 0;
  }

  INTR.new_if &= ~mask;

  /* Now write the LSB of PC. */
  RSP--; WRITE8(RSP, REG.PC);
  REG.PC = vector;

  if (delay) {
    tick(e);
  }
  tick(e);
  tick(e);
}